

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::(anonymous_namespace)::BasicAtomicCase2::GenSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this,uvec3 *param_1,uvec3 *num_groups)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  stringstream local_1c0 [8];
  stringstream ss;
  ostream local_1b0;
  undefined1 local_34 [8];
  uvec3 global_size;
  uvec3 *num_groups_local;
  uvec3 *local_size_local;
  BasicAtomicCase2 *this_local;
  
  global_size.m_data._4_8_ = num_groups;
  tcu::operator*((tcu *)local_34,param_1,num_groups);
  std::__cxx11::stringstream::stringstream(local_1c0);
  poVar4 = std::operator<<(&local_1b0,"\nlayout(local_size_x = ");
  uVar1 = tcu::Vector<unsigned_int,_3>::x(param_1);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1);
  poVar4 = std::operator<<(poVar4,", local_size_y = ");
  uVar1 = tcu::Vector<unsigned_int,_3>::y(param_1);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1);
  poVar4 = std::operator<<(poVar4,", local_size_z = ");
  uVar1 = tcu::Vector<unsigned_int,_3>::z(param_1);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1);
  poVar4 = std::operator<<(poVar4,") in;\nconst uvec3 kGlobalSize = uvec3(");
  uVar1 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)local_34);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1);
  poVar4 = std::operator<<(poVar4,", ");
  uVar1 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)local_34);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1);
  poVar4 = std::operator<<(poVar4,", ");
  uVar1 = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)local_34);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1);
  poVar4 = std::operator<<(poVar4,
                           ");\nlayout(std430, binding = 0) buffer OutputU {\n  uint g_uint_out[");
  uVar1 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)local_34);
  uVar2 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)local_34);
  uVar3 = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)local_34);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1 * uVar2 * uVar3);
  poVar4 = std::operator<<(poVar4,
                           "];\n};\nlayout(std430, binding = 1) buffer OutputI {\n  int data[");
  uVar1 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)local_34);
  uVar2 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)local_34);
  uVar3 = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)local_34);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1 * uVar2 * uVar3);
  std::operator<<(poVar4,
                  "];\n} g_int_out;\nuniform uint g_uint_value[8] = uint[8](3u, 1u, 2u, 0x1u, 0x3u, 0x1u, 0x2u, 0x7u);\nvoid main() {\n  const uint global_index = gl_GlobalInvocationID.x +\n                            gl_GlobalInvocationID.y * kGlobalSize.x +\n                            gl_GlobalInvocationID.z * kGlobalSize.x * kGlobalSize.y;\n  atomicExchange(g_uint_out[global_index], g_uint_value[0]);\n  atomicMin(g_uint_out[global_index], g_uint_value[1]);\n  atomicMax(g_uint_out[global_index], g_uint_value[2]);\n  atomicAnd(g_uint_out[global_index], g_uint_value[3]);\n  atomicOr(g_uint_out[global_index], g_uint_value[4]);\n  if (g_uint_value[0] > 0u) {\n    barrier();\n    atomicXor(g_uint_out[global_index], g_uint_value[5]);\n  }\n  atomicCompSwap(g_uint_out[global_index], g_uint_value[6], g_uint_value[7]);\n\n  atomicExchange(g_int_out.data[global_index], 3);\n  atomicMin(g_int_out.data[global_index], 1);\n  atomicMax(g_int_out.data[global_index], 2);\n  atomicAnd(g_int_out.data[global_index], 0x1);\n  atomicOr(g_int_out.data[global_index], 0x3);\n  atomicXor(g_int_out.data[global_index], 0x1);\n  atomicCompSwap(g_int_out.data[global_index], 0x2, 0x7);\n}"
                 );
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return __return_storage_ptr__;
}

Assistant:

std::string GenSource(const uvec3& local_size, const uvec3& num_groups)
	{
		const uvec3		  global_size = local_size * num_groups;
		std::stringstream ss;
		ss << NL "layout(local_size_x = " << local_size.x() << ", local_size_y = " << local_size.y()
		   << ", local_size_z = " << local_size.z() << ") in;" NL "const uvec3 kGlobalSize = uvec3(" << global_size.x()
		   << ", " << global_size.y() << ", " << global_size.z()
		   << ");" NL "layout(std430, binding = 0) buffer OutputU {" NL "  uint g_uint_out["
		   << global_size.x() * global_size.y() * global_size.z()
		   << "];" NL "};" NL "layout(std430, binding = 1) buffer OutputI {" NL "  int data["
		   << global_size.x() * global_size.y() * global_size.z()
		   << "];" NL "} g_int_out;" NL
			  "uniform uint g_uint_value[8] = uint[8](3u, 1u, 2u, 0x1u, 0x3u, 0x1u, 0x2u, 0x7u);" NL "void main() {" NL
			  "  const uint global_index = gl_GlobalInvocationID.x +" NL
			  "                            gl_GlobalInvocationID.y * kGlobalSize.x +" NL
			  "                            gl_GlobalInvocationID.z * kGlobalSize.x * kGlobalSize.y;" NL
			  "  atomicExchange(g_uint_out[global_index], g_uint_value[0]);" NL
			  "  atomicMin(g_uint_out[global_index], g_uint_value[1]);" NL
			  "  atomicMax(g_uint_out[global_index], g_uint_value[2]);" NL
			  "  atomicAnd(g_uint_out[global_index], g_uint_value[3]);" NL
			  "  atomicOr(g_uint_out[global_index], g_uint_value[4]);" NL "  if (g_uint_value[0] > 0u) {" NL
			  "    barrier();" // not needed here, just check if compiler accepts it in a control flow
			NL "    atomicXor(g_uint_out[global_index], g_uint_value[5]);" NL "  }" NL
			  "  atomicCompSwap(g_uint_out[global_index], g_uint_value[6], g_uint_value[7]);" NL NL
			  "  atomicExchange(g_int_out.data[global_index], 3);" NL "  atomicMin(g_int_out.data[global_index], 1);" NL
			  "  atomicMax(g_int_out.data[global_index], 2);" NL "  atomicAnd(g_int_out.data[global_index], 0x1);" NL
			  "  atomicOr(g_int_out.data[global_index], 0x3);" NL "  atomicXor(g_int_out.data[global_index], 0x1);" NL
			  "  atomicCompSwap(g_int_out.data[global_index], 0x2, 0x7);" NL "}";
		return ss.str();
	}